

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Input.cxx
# Opt level: O2

void __thiscall Fl_File_Input::draw(Fl_File_Input *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Fl_Boxtype t;
  bool bVar10;
  bool bVar11;
  
  t = (Fl_Boxtype)(this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_;
  bVar5 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.damage_;
  if ((bVar5 & 0x90) != 0) {
    draw_buttons(this);
    bVar5 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.damage_;
  }
  bVar10 = (Fl_File_Input *)Fl::focus_ != this;
  bVar11 = (this->super_Fl_Input).super_Fl_Input_.size_ == 0;
  if (!(bool)(~(bVar11 && bVar10) & -1 < (char)bVar5)) {
    Fl_Widget::draw_box((Fl_Widget *)this,t,
                        (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_,
                        (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_ + 10,
                        (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_,
                        (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.h_ + -10,
                        (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.color_);
  }
  if ((bVar11 && bVar10) && -1 < (char)bVar5) {
    return;
  }
  iVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
  iVar6 = Fl::box_dx(t);
  iVar2 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
  iVar7 = Fl::box_dy(t);
  iVar3 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
  iVar8 = Fl::box_dw(t);
  iVar4 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.h_;
  iVar9 = Fl::box_dh(t);
  Fl_Input_::drawtext((Fl_Input_ *)this,iVar1 + iVar6 + 3,iVar2 + iVar7 + 10,(iVar3 - iVar8) + -6,
                      (iVar4 - iVar9) + -10);
  return;
}

Assistant:

void Fl_File_Input::draw() {
  Fl_Boxtype b = box();
  if (damage() & (FL_DAMAGE_BAR | FL_DAMAGE_ALL)) draw_buttons();
  // this flag keeps Fl_Input_::drawtext from drawing a bogus box!
  char must_trick_fl_input_ = 
    Fl::focus()!=this && !size() && !(damage()&FL_DAMAGE_ALL);
  if ((damage() & FL_DAMAGE_ALL) || must_trick_fl_input_) 
    draw_box(b,x(),y()+DIR_HEIGHT,w(),h()-DIR_HEIGHT,color());
  if (!must_trick_fl_input_) 
    Fl_Input_::drawtext(x()+Fl::box_dx(b)+3, y()+Fl::box_dy(b)+DIR_HEIGHT,
		        w()-Fl::box_dw(b)-6, h()-Fl::box_dh(b)-DIR_HEIGHT);
}